

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.hpp
# Opt level: O0

void __thiscall
hta::storage::file::File<hta::storage::file::Metric::Header,_hta::TimeAggregate>::File
          (File<hta::storage::file::Metric::Header,_hta::TimeAggregate> *this,path *filename,
          openmode mode)

{
  _Ios_Openmode __mode;
  openmode mode_local;
  path *filename_local;
  File<hta::storage::file::Metric::Header,_hta::TimeAggregate> *this_local;
  
  Catch::clara::std::filesystem::__cxx11::path::path((path *)this,(path *)filename);
  __mode = std::operator|(mode,_S_bin);
  std::fstream::fstream<std::filesystem::__cxx11::path,std::filesystem::__cxx11::path>
            ((fstream *)&this->stream_,filename,__mode);
  std::fpos<__mbstate_t>::fpos(&this->data_begin_);
  check_stream(this,"open file");
  return;
}

Assistant:

File(const std::filesystem::path& filename, std::ios_base::openmode mode)
    : filename_(filename), stream_(filename, mode | std::ios_base::binary)
    {
        check_stream("open file");
    }